

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.c
# Opt level: O0

XXH_errorcode XXH64_update(XXH64_state_t *state_in,void *input,size_t len)

{
  BYTE *pBVar1;
  U64 UVar2;
  U64 UVar3;
  XXH_endianess endian_detected;
  size_t len_local;
  void *input_local;
  XXH64_state_t *state_in_local;
  U64 v4_1;
  U64 v3_1;
  U64 v2_1;
  U64 v1_1;
  BYTE *limit_1;
  BYTE *bEnd_1;
  BYTE *p_1;
  U64 local_2e0;
  U64 v4;
  U64 v3;
  U64 v2;
  U64 v1;
  BYTE *limit;
  BYTE *bEnd;
  BYTE *p;
  
  pBVar1 = (BYTE *)((long)input + len);
  state_in->total_len = len + state_in->total_len;
  if (state_in->memsize + len < 0x20) {
    if (input != (void *)0x0) {
      XXH_memcpy((void *)((long)state_in->mem64 + (ulong)state_in->memsize),input,len);
    }
    state_in->memsize = (int)len + state_in->memsize;
  }
  else {
    bEnd = (BYTE *)input;
    if (state_in->memsize != 0) {
      XXH_memcpy((void *)((long)state_in->mem64 + (ulong)state_in->memsize),input,
                 (ulong)(0x20 - state_in->memsize));
      UVar3 = state_in->v1;
      UVar2 = XXH_read64(state_in->mem64);
      UVar3 = XXH64_round(UVar3,UVar2);
      state_in->v1 = UVar3;
      UVar3 = state_in->v2;
      UVar2 = XXH_read64(state_in->mem64 + 1);
      UVar3 = XXH64_round(UVar3,UVar2);
      state_in->v2 = UVar3;
      UVar3 = state_in->v3;
      UVar2 = XXH_read64(state_in->mem64 + 2);
      UVar3 = XXH64_round(UVar3,UVar2);
      state_in->v3 = UVar3;
      UVar3 = state_in->v4;
      UVar2 = XXH_read64(state_in->mem64 + 3);
      UVar3 = XXH64_round(UVar3,UVar2);
      state_in->v4 = UVar3;
      bEnd = (BYTE *)((long)input + (ulong)(0x20 - state_in->memsize));
      state_in->memsize = 0;
    }
    if (bEnd + 0x20 <= pBVar1) {
      v2 = state_in->v1;
      v3 = state_in->v2;
      v4 = state_in->v3;
      local_2e0 = state_in->v4;
      do {
        UVar3 = XXH_read64(bEnd);
        v2 = XXH64_round(v2,UVar3);
        UVar3 = XXH_read64(bEnd + 8);
        v3 = XXH64_round(v3,UVar3);
        UVar3 = XXH_read64(bEnd + 0x10);
        v4 = XXH64_round(v4,UVar3);
        UVar3 = XXH_read64(bEnd + 0x18);
        local_2e0 = XXH64_round(local_2e0,UVar3);
        bEnd = bEnd + 0x20;
      } while (bEnd <= pBVar1 + -0x20);
      state_in->v1 = v2;
      state_in->v2 = v3;
      state_in->v3 = v4;
      state_in->v4 = local_2e0;
    }
    if (bEnd < pBVar1) {
      XXH_memcpy(state_in->mem64,bEnd,(long)pBVar1 - (long)bEnd);
      state_in->memsize = (int)pBVar1 - (int)bEnd;
    }
  }
  return XXH_OK;
}

Assistant:

XXH_PUBLIC_API XXH_errorcode XXH64_update (XXH64_state_t* state_in, const void* input, size_t len)
{
    XXH_endianess endian_detected = (XXH_endianess)XXH_CPU_LITTLE_ENDIAN;

    if ((endian_detected==XXH_littleEndian) || XXH_FORCE_NATIVE_FORMAT)
        return XXH64_update_endian(state_in, input, len, XXH_littleEndian);
    else
        return XXH64_update_endian(state_in, input, len, XXH_bigEndian);
}